

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O1

void __thiscall
gl4cts::GPUShaderFP64Test2::prepareUniformVerification
          (GPUShaderFP64Test2 *this,shaderStage shader_stage,uniformTypeDetails *uniform_type,
          string *out_source_code)

{
  ostream *poVar1;
  uint uVar2;
  ulong uVar3;
  bool bVar4;
  stringstream stream;
  long *local_1d8 [2];
  long local_1c8 [2];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  uVar2 = uniform_type->m_n_rows * uniform_type->m_n_columns;
  getAmountUniforms(this,shader_stage,uniform_type);
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"    int verification_result = ",0x1e);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,";\n\n    for (int i = 0; i < ",0x1b);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"; ++i)\n    {\n        if (",0x19);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(uniform_type->m_type_name)._M_dataplus._M_p,
                      (uniform_type->m_type_name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"(",1);
  if (uVar2 != 0) {
    uVar3 = 1;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"i * (",5);
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,") + ",4);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      if (uVar3 != uVar2) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
      }
      bVar4 = uVar3 != uVar2;
      uVar3 = uVar3 + 1;
    } while (bVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             ") != uniform_array[i])\n        {\n           verification_result = ",0x42);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,";\n        }\n    }\n",0x12);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)out_source_code,(string *)local_1d8);
  if (local_1d8[0] != local_1c8) {
    operator_delete(local_1d8[0],local_1c8[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return;
}

Assistant:

void GPUShaderFP64Test2::prepareUniformVerification(shaderStage shader_stage, const uniformTypeDetails& uniform_type,
													std::string& out_source_code) const
{
	glw::GLuint		  element_ordinal = 1;
	const glw::GLuint n_columns		  = uniform_type.m_n_columns;
	const glw::GLuint n_rows		  = uniform_type.m_n_rows;
	const glw::GLuint n_elements	  = n_columns * n_rows;
	const glw::GLuint n_uniforms	  = getAmountUniforms(shader_stage, uniform_type);
	std::stringstream stream;

	/*
	 * int verification_result = M_RESULT_SUCCESS;
	 *
	 * for (int i = 0; i < N_UNIFORMS; ++i)
	 * {
	 *     if (TYPE_NAME(i * (N_ELEMENTS) + 1) != uniform_array[i])
	 *     {
	 *         verification_result = M_RESULT_FAILURE
	 *     }
	 * }
	 */
	stream << "    int verification_result = " << m_result_success << ";\n"
																	  "\n"
																	  "    for (int i = 0; i < "
		   << n_uniforms << "; ++i)\n"
							"    {\n"
							"        if ("
		   << uniform_type.m_type_name << "(";

	for (glw::GLuint element = 0; element < n_elements; ++element, ++element_ordinal)
	{
		stream << "i * (" << n_elements << ") + " << element + 1;

		if (n_elements != element + 1)
		{
			stream << ", ";
		}
	}

	stream << ") != uniform_array[i])\n"
			  "        {\n"
			  "           verification_result = "
		   << m_result_failure << ";\n"
								  "        }\n"
								  "    }\n";

	out_source_code = stream.str();
}